

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeopyramid.cpp
# Opt level: O1

void pzgeom::TPZGeoPyramid::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  TPZGeoNode *this;
  int j;
  long lVar4;
  long lVar5;
  int i_1;
  TPZManVector<long,_5> nodeindexes;
  int64_t index;
  TPZManVector<double,_3> co;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  TPZVec<long> local_130;
  long local_110 [5];
  double local_e8;
  undefined1 local_e0 [8];
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  TPZManVector<double,_3>::TPZManVector(&local_d8,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZVec<long>::TPZVec(&local_130,0);
  local_130.fStore = local_110;
  local_130._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b52d0;
  local_130.fNElements = 5;
  local_130.fNAlloc = 0;
  pdVar1 = size->fStore;
  pdVar2 = lowercorner->fStore;
  lVar5 = 0;
  do {
    local_a0.super_TPZVec<double>.fStore[lVar5] = pdVar1[lVar5] / 3.0;
    local_68.super_TPZVec<double>.fStore[lVar5] = pdVar2[lVar5] + 0.5;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    pztopology::TPZPyramid::ParametricDomainNodeCoord((int)lVar5,&local_d8.super_TPZVec<double>);
    lVar4 = 0;
    do {
      local_e8 = local_a0.super_TPZVec<double>.fStore[lVar4] *
                 local_d8.super_TPZVec<double>.fStore[lVar4] +
                 local_68.super_TPZVec<double>.fStore[lVar4];
      iVar3 = rand();
      local_d8.super_TPZVec<double>.fStore[lVar4] =
           ((double)iVar3 * 0.2) / 2147483647.0 + local_e8 + -0.1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    local_130.fStore[lVar5] = (long)iVar3;
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
    TPZGeoNode::Initialize(this,&local_d8.super_TPZVec<double>,gmesh);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,5,&local_130,(ulong)(uint)matid,local_e0,1);
  if (local_130.fStore == local_110) {
    local_130.fStore = (long *)0x0;
  }
  local_130.fNAlloc = 0;
  local_130._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_130.fStore != (long *)0x0) {
    operator_delete__(local_130.fStore);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_d8);
  return;
}

Assistant:

void
    TPZGeoPyramid::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size) {
        TPZManVector<REAL, 3> co(3), shift(3), scale(3);
        TPZManVector<int64_t, 5> nodeindexes(5);
        for (int i = 0; i < 3; i++) {
            scale[i] = size[i] / 3.;
            shift[i] = 1. / 2. + lowercorner[i];
        }

        for (int i = 0; i < NCornerNodes; i++) {
            ParametricDomainNodeCoord(i, co);
            for (int j = 0; j < 3; j++) {
                co[j] = shift[j] + scale[j] * co[j] + (rand() * 0.2 / RAND_MAX) - 0.1;
            }
            nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
            gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
        }
        int64_t index;
        gmesh.CreateGeoElement(EPiramide, nodeindexes, matid, index);
    }